

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void add_csc_range_penalty<PredictionData<double,int>>
               (WorkerForPredictCSC *workspace,PredictionData<double,_int> *prediction_data,
               double *weights_arr,size_t col_num,double range_low,double range_high)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  int *piVar7;
  reference pvVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  bool bVar9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  size_t *row_3;
  size_t row_2;
  size_t row_1;
  size_t *row;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec8;
  difference_type in_stack_fffffffffffffed0;
  ulong *puVar10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  unsigned_long *in_stack_fffffffffffffef0;
  ulong *__first;
  double local_c8;
  ulong *local_a0;
  pointer local_98;
  pointer local_90;
  ulong *local_88;
  long local_70;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_70 = (long)*(int *)(*(long *)(in_RSI + 0x40) + in_RCX * 4);
  lVar3 = (long)(*(int *)(*(long *)(in_RSI + 0x40) + 4 + in_RCX * 4) + -1);
  uVar4 = (ulong)*(int *)(*(long *)(in_RSI + 0x38) + lVar3 * 4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f7a56);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f7a7e);
  local_a0 = std::lower_bound<unsigned_long*,int>
                       (in_stack_fffffffffffffef0,
                        (unsigned_long *)
                        CONCAT17(in_stack_fffffffffffffeef,
                                 CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                        (int *)in_stack_fffffffffffffee0._M_current);
  if ((0.0 < in_XMM0_Qa) || (local_88 = local_a0, in_XMM1_Qa < 0.0)) {
    if (in_RDX == 0) {
      for (local_90 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_90 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_90 = (pointer)((long)local_90 + 1)) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)local_90);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[3].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar8);
        *pvVar6 = *pvVar6 + -1.0;
      }
    }
    else {
      for (local_98 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_98 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_98 = (pointer)((long)local_98 + 1)) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)local_98);
        dVar1 = *(double *)(in_RDX + *pvVar8 * 8);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)local_98);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[3].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar8);
        *pvVar6 = *pvVar6 - dVar1;
      }
    }
    while( true ) {
      __first = local_a0;
      puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f8015);
      bVar9 = false;
      if ((__first !=
           puVar5 + (long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1) &&
         (bVar9 = false, local_70 != lVar3 + 1)) {
        bVar9 = *local_a0 <= uVar4;
      }
      if (!bVar9) break;
      if (*(int *)(*(long *)(in_RSI + 0x38) + local_70 * 4) == (int)*local_a0) {
        uVar2 = std::isnan(*(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8));
        in_stack_fffffffffffffeef = true;
        if (((uVar2 & 1) == 0) &&
           (in_stack_fffffffffffffeee = false, in_stack_fffffffffffffeef = in_stack_fffffffffffffeee
           , in_XMM0_Qa <= *(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8))) {
          in_stack_fffffffffffffeee =
               *(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8) <= in_XMM1_Qa;
          in_stack_fffffffffffffeef = in_stack_fffffffffffffeee;
        }
        if ((bool)in_stack_fffffffffffffeef != false) {
          if (in_RDX == 0) {
            puVar5 = (unsigned_long *)0x3ff0000000000000;
          }
          else {
            puVar5 = *(unsigned_long **)(in_RDX + *local_a0 * 8);
          }
          in_stack_fffffffffffffee0._M_current = puVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &in_RDI[3].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,*local_a0);
          *pvVar6 = (double)puVar5 + *pvVar6;
        }
        puVar10 = local_a0;
        puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f81c9);
        if (puVar10 ==
            puVar5 + (long)in_RDI[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish) {
          return;
        }
        if (local_70 == lVar3) {
          return;
        }
        local_a0 = local_a0 + 1;
        piVar7 = std::lower_bound<int*,unsigned_long>
                           ((int *)__first,
                            (int *)CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     in_stack_fffffffffffffee8)),
                            in_stack_fffffffffffffee0._M_current);
        local_70 = (long)piVar7 - *(long *)(in_RSI + 0x38) >> 2;
      }
      else if ((int)*local_a0 < *(int *)(*(long *)(in_RSI + 0x38) + local_70 * 4)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f82b7);
        local_a0 = std::lower_bound<unsigned_long*,int>
                             (__first,(unsigned_long *)
                                      CONCAT17(in_stack_fffffffffffffeef,
                                               CONCAT16(in_stack_fffffffffffffeee,
                                                        in_stack_fffffffffffffee8)),
                              (int *)in_stack_fffffffffffffee0._M_current);
      }
      else {
        piVar7 = std::lower_bound<int*,unsigned_long>
                           ((int *)__first,
                            (int *)CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     in_stack_fffffffffffffee8)),
                            in_stack_fffffffffffffee0._M_current);
        local_70 = (long)piVar7 - *(long *)(in_RSI + 0x38) >> 2;
      }
    }
  }
  else {
    while( true ) {
      puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f7b1d);
      bVar9 = false;
      if ((local_88 !=
           puVar5 + (long)in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1) &&
         (bVar9 = false, local_70 != lVar3 + 1)) {
        bVar9 = *local_88 <= uVar4;
      }
      if (!bVar9) break;
      if (*(int *)(*(long *)(in_RSI + 0x38) + local_70 * 4) == (int)*local_88) {
        uVar2 = std::isnan(*(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8));
        bVar9 = false;
        if (((uVar2 & 1) == 0) &&
           (bVar9 = true, in_XMM0_Qa <= *(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8))) {
          bVar9 = in_XMM1_Qa < *(double *)(*(long *)(in_RSI + 0x30) + local_70 * 8);
        }
        if (bVar9) {
          if (in_RDX == 0) {
            local_c8 = 1.0;
          }
          else {
            local_c8 = *(double *)(in_RDX + *local_88 * 8);
          }
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &in_RDI[3].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,*local_88);
          *pvVar6 = *pvVar6 - local_c8;
        }
        puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f7ce4);
        if (local_88 ==
            puVar5 + (long)in_RDI[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish) {
          return;
        }
        if (local_70 == lVar3) {
          return;
        }
        local_88 = local_88 + 1;
        piVar7 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_fffffffffffffef0,
                            (int *)CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     in_stack_fffffffffffffee8)),
                            in_stack_fffffffffffffee0._M_current);
        local_70 = (long)piVar7 - *(long *)(in_RSI + 0x38) >> 2;
      }
      else if ((int)*local_88 < *(int *)(*(long *)(in_RSI + 0x38) + local_70 * 4)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2f7dd3);
        local_88 = std::lower_bound<unsigned_long*,int>
                             (in_stack_fffffffffffffef0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ),(int *)in_stack_fffffffffffffee0._M_current);
      }
      else {
        piVar7 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_fffffffffffffef0,
                            (int *)CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     in_stack_fffffffffffffee8)),
                            in_stack_fffffffffffffee0._M_current);
        local_70 = (long)piVar7 - *(long *)(in_RSI + 0x38) >> 2;
      }
    }
  }
  return;
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}